

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_internal_wrap.cpp
# Opt level: O3

hrgls_Status hrgls_APIGetNextLogMessage(hrgls_API api,hrgls_Message *message)

{
  Message_private *pMVar1;
  hrgls_Status hVar2;
  hrgls_Message MessageToCopy;
  vector<hrgls::Message,_std::allocator<hrgls::Message>_> ret;
  vector<hrgls::Message,_std::allocator<hrgls::Message>_> local_30;
  
  if (api == (hrgls_API)0x0) {
    hVar2 = 0x3ee;
  }
  else if (message == (hrgls_Message *)0x0) {
    hVar2 = 0x3e9;
  }
  else {
    hrgls::API::GetPendingLogMessages(&local_30,api->api,1);
    if (local_30.super__Vector_base<hrgls::Message,_std::allocator<hrgls::Message>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_30.super__Vector_base<hrgls::Message,_std::allocator<hrgls::Message>_>._M_impl.
        super__Vector_impl_data._M_start) {
      pMVar1 = (local_30.super__Vector_base<hrgls::Message,_std::allocator<hrgls::Message>_>._M_impl
                .super__Vector_impl_data._M_start)->m_private;
      MessageToCopy = (hrgls_Message)0x0;
      if (pMVar1 != (Message_private *)0x0) {
        MessageToCopy = pMVar1->Message;
        hVar2 = 0;
        if (MessageToCopy == (hrgls_Message)0x0) {
          hVar2 = 0x3ee;
        }
        pMVar1->status = hVar2;
      }
      hVar2 = hrgls_MessageCopy(message,MessageToCopy);
      if (hVar2 != 0) {
        std::vector<hrgls::Message,_std::allocator<hrgls::Message>_>::~vector(&local_30);
        return hVar2;
      }
    }
    std::vector<hrgls::Message,_std::allocator<hrgls::Message>_>::~vector(&local_30);
    hVar2 = hrgls::API::GetStatus(api->api);
  }
  return hVar2;
}

Assistant:

HRGLS_EXPORT hrgls_Status hrgls_APIGetNextLogMessage(hrgls_API api, hrgls_Message *message)
  {
    hrgls_Status s = hrgls_STATUS_OKAY;
    if (!api) {
      return hrgls_STATUS_NULL_OBJECT_POINTER;
    }
    if (!message) {
      return hrgls_STATUS_BAD_PARAMETER;
    }

    // Get at most a single message.
    try {
      ::std::vector<::hrgls::Message> ret = api->api->GetPendingLogMessages(1);
      if (ret.size() > 0) {
        // Copy the first (only) message into the pointed-to return location.
        if (hrgls_STATUS_OKAY != (s = hrgls_MessageCopy(message, ret.front().RawMessage()))) {
          return s;
        }
      }
    } catch (...) {
      return hrgls_STATUS_INTERNAL_EXCEPTION;
    }

    return api->api->GetStatus();
  }